

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterInit(sqlite3 *db,int nField,VdbeCursor *pCsr)

{
  ushort uVar1;
  u32 uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  u64 n;
  void *pvVar6;
  long in_RDX;
  int in_ESI;
  sqlite3 *in_RDI;
  u32 szPma;
  SortSubtask *pTask;
  int nWorker;
  int rc;
  int sz;
  int szKeyInfo;
  KeyInfo *pKeyInfo;
  VdbeSorter *pSorter;
  int mxCache;
  int i;
  int pgsz;
  u64 in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa0;
  int local_48;
  int local_44;
  u32 local_24;
  int local_20;
  
  local_44 = 0;
  iVar3 = sqlite3TempInMemory(in_RDI);
  if ((iVar3 == 0) && (sqlite3Config.bCoreMutex != 0)) {
    local_48 = in_RDI->aLimit[0xb];
  }
  else {
    local_48 = 0;
  }
  uVar1 = *(ushort *)(*(long *)(in_RDX + 0x10) + 6);
  piVar5 = (int *)sqlite3DbMallocZero(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(int **)(in_RDX + 0x48) = piVar5;
  if (piVar5 == (int *)0x0) {
    local_44 = 7;
  }
  else {
    pvVar6 = (void *)((long)piVar5 + (long)(local_48 * 0x60 + 0xc0));
    *(void **)(piVar5 + 10) = pvVar6;
    memcpy(pvVar6,*(void **)(in_RDX + 0x10),(long)(int)((uVar1 - 1) * 8 + 0x28));
    *(undefined8 *)((long)pvVar6 + 0x10) = 0;
    if ((in_ESI != 0) && (local_48 == 0)) {
      *(short *)((long)pvVar6 + 6) = (short)in_ESI;
    }
    iVar3 = sqlite3BtreeGetPageSize(in_RDI->aDb->pBt);
    piVar5[3] = iVar3;
    *(char *)((long)piVar5 + 0x5b) = (char)local_48 + '\x01';
    *(bool *)((long)piVar5 + 0x59) = 1 < *(byte *)((long)piVar5 + 0x5b);
    *(sqlite3 **)(piVar5 + 8) = in_RDI;
    for (local_20 = 0; local_20 < (int)(uint)*(byte *)((long)piVar5 + 0x5b); local_20 = local_20 + 1
        ) {
      *(int **)(piVar5 + (long)local_20 * 0x18 + 0x1c) = piVar5;
    }
    iVar4 = sqlite3TempInMemory(in_RDI);
    uVar2 = sqlite3Config.szPma;
    if (iVar4 == 0) {
      *piVar5 = sqlite3Config.szPma * iVar3;
      local_24 = in_RDI->aDb->pSchema->cache_size;
      if ((int)local_24 < (int)uVar2) {
        local_24 = uVar2;
      }
      if ((long)(int)local_24 * (long)iVar3 < 0x20000000) {
        n = (long)(int)local_24 * (long)iVar3;
      }
      else {
        n = 0x20000000;
      }
      piVar5[1] = (int)n;
      if (sqlite3Config.pScratch == (void *)0x0) {
        piVar5[0x15] = iVar3;
        pvVar6 = sqlite3Malloc(n);
        *(void **)(piVar5 + 0x10) = pvVar6;
        if (*(long *)(piVar5 + 0x10) == 0) {
          local_44 = 7;
        }
      }
    }
  }
  return local_44;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterInit(
  sqlite3 *db,                    /* Database connection (for malloc()) */
  int nField,                     /* Number of key fields in each record */
  VdbeCursor *pCsr                /* Cursor that holds the new sorter */
){
  int pgsz;                       /* Page size of main database */
  int i;                          /* Used to iterate through aTask[] */
  int mxCache;                    /* Cache size */
  VdbeSorter *pSorter;            /* The new sorter */
  KeyInfo *pKeyInfo;              /* Copy of pCsr->pKeyInfo with db==0 */
  int szKeyInfo;                  /* Size of pCsr->pKeyInfo in bytes */
  int sz;                         /* Size of pSorter in bytes */
  int rc = SQLITE_OK;
#if SQLITE_MAX_WORKER_THREADS==0
# define nWorker 0
#else
  int nWorker;
#endif

  /* Initialize the upper limit on the number of worker threads */
#if SQLITE_MAX_WORKER_THREADS>0
  if( sqlite3TempInMemory(db) || sqlite3GlobalConfig.bCoreMutex==0 ){
    nWorker = 0;
  }else{
    nWorker = db->aLimit[SQLITE_LIMIT_WORKER_THREADS];
  }
#endif

  /* Do not allow the total number of threads (main thread + all workers)
  ** to exceed the maximum merge count */
#if SQLITE_MAX_WORKER_THREADS>=SORTER_MAX_MERGE_COUNT
  if( nWorker>=SORTER_MAX_MERGE_COUNT ){
    nWorker = SORTER_MAX_MERGE_COUNT-1;
  }
#endif

  assert( pCsr->pKeyInfo && pCsr->pBt==0 );
  szKeyInfo = sizeof(KeyInfo) + (pCsr->pKeyInfo->nField-1)*sizeof(CollSeq*);
  sz = sizeof(VdbeSorter) + nWorker * sizeof(SortSubtask);

  pSorter = (VdbeSorter*)sqlite3DbMallocZero(db, sz + szKeyInfo);
  pCsr->pSorter = pSorter;
  if( pSorter==0 ){
    rc = SQLITE_NOMEM;
  }else{
    pSorter->pKeyInfo = pKeyInfo = (KeyInfo*)((u8*)pSorter + sz);
    memcpy(pKeyInfo, pCsr->pKeyInfo, szKeyInfo);
    pKeyInfo->db = 0;
    if( nField && nWorker==0 ) pKeyInfo->nField = nField;
    pSorter->pgsz = pgsz = sqlite3BtreeGetPageSize(db->aDb[0].pBt);
    pSorter->nTask = nWorker + 1;
    pSorter->bUseThreads = (pSorter->nTask>1);
    pSorter->db = db;
    for(i=0; i<pSorter->nTask; i++){
      SortSubtask *pTask = &pSorter->aTask[i];
      pTask->pSorter = pSorter;
    }

    if( !sqlite3TempInMemory(db) ){
      u32 szPma = sqlite3GlobalConfig.szPma;
      pSorter->mnPmaSize = szPma * pgsz;
      mxCache = db->aDb[0].pSchema->cache_size;
      if( mxCache<(int)szPma ) mxCache = (int)szPma;
      pSorter->mxPmaSize = MIN((i64)mxCache*pgsz, SQLITE_MAX_PMASZ);

      /* EVIDENCE-OF: R-26747-61719 When the application provides any amount of
      ** scratch memory using SQLITE_CONFIG_SCRATCH, SQLite avoids unnecessary
      ** large heap allocations.
      */
      if( sqlite3GlobalConfig.pScratch==0 ){
        assert( pSorter->iMemory==0 );
        pSorter->nMemory = pgsz;
        pSorter->list.aMemory = (u8*)sqlite3Malloc(pgsz);
        if( !pSorter->list.aMemory ) rc = SQLITE_NOMEM;
      }
    }
  }

  return rc;
}